

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Convolution3DLayerParams::MergePartialFromCodedStream
          (Convolution3DLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short extraout_AX_02;
  short extraout_AX_03;
  short extraout_AX_04;
  short extraout_AX_05;
  short extraout_AX_06;
  short extraout_AX_07;
  short extraout_AX_08;
  short extraout_AX_09;
  short extraout_AX_10;
  short extraout_AX_11;
  short extraout_AX_12;
  short extraout_AX_13;
  short extraout_AX_14;
  short extraout_AX_15;
  short extraout_AX_16;
  short extraout_AX_17;
  short extraout_AX_18;
  short sVar6;
  uint uVar7;
  uint32 uVar8;
  WeightParams *pWVar9;
  pair<int,_int> pVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  int byte_limit;
  int iVar14;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar12 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar8 = (uint)bVar2, (~(uint)*pbVar1 & uVar12) < 0x80)) goto LAB_002306fe;
        uVar12 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = (ulong)uVar12 | 0x100000000;
    }
    else {
LAB_002306fe:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar13 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar8 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto switchD_002303b7_caseD_17;
    uVar7 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar13;
    if (uVar7 < 0x3d) {
      if (uVar7 < 0x2a) {
        if (uVar7 < 0x14) {
          if (uVar7 == 1) {
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_08;
          }
          else if (uVar7 == 2) {
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_09;
          }
          else {
            if (uVar7 != 10) goto switchD_002303b7_caseD_17;
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_00;
          }
        }
        else {
          switch(uVar7) {
          case 0x14:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX;
            break;
          case 0x15:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_04;
            break;
          case 0x16:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_05;
            break;
          case 0x17:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
          case 0x1c:
          case 0x1d:
          case 0x1e:
            goto switchD_002303b7_caseD_17;
          case 0x1f:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_06;
            break;
          case 0x20:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_03;
            break;
          case 0x21:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_07;
            break;
          default:
            if (uVar7 == 0x28) {
              MergePartialFromCodedStream();
              sVar6 = extraout_AX_11;
            }
            else {
              if (uVar7 != 0x29) goto switchD_002303b7_caseD_17;
              MergePartialFromCodedStream();
              sVar6 = extraout_AX_02;
            }
          }
        }
      }
      else {
        if (uVar7 == 0x3c) {
          if (cVar11 == -0x1e) {
            if (this->weights_ == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar9);
              this->weights_ = pWVar9;
            }
            pWVar9 = this->weights_;
            goto LAB_0023040b;
          }
          goto switchD_002303b7_caseD_17;
        }
        if (uVar7 == 0x2a) {
          MergePartialFromCodedStream();
          sVar6 = extraout_AX_10;
        }
        else {
          if (uVar7 != 0x32) goto switchD_002303b7_caseD_17;
          MergePartialFromCodedStream();
          sVar6 = extraout_AX_01;
        }
      }
      goto LAB_002306de;
    }
    switch(uVar7) {
    case 0x46:
      if (cVar11 != '0') goto switchD_002303b7_caseD_17;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar13 = (ulong)bVar2;
        uVar8 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_0023072f;
        input->buffer_ = pbVar3 + 1;
        bVar5 = true;
      }
      else {
        uVar8 = 0;
LAB_0023072f:
        uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
        bVar5 = -1 < (long)uVar13;
      }
      if (!bVar5) {
        iVar14 = 6;
        goto LAB_002302f8;
      }
      this->paddingtype_ = (int)uVar13;
      goto LAB_002302f5;
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
      goto switchD_002303b7_caseD_17;
    case 0x50:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_17;
      break;
    case 0x51:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_14;
      break;
    case 0x52:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_16;
      break;
    case 0x53:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_12;
      break;
    case 0x54:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_13;
      break;
    case 0x55:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_15;
      break;
    case 0x56:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_18;
      break;
    case 0x57:
      if (cVar11 == -0x48) {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (2,0x2ba,input,&this->outputshape_);
      }
      else {
        if ((uVar12 & 0xff) != 0xba) goto switchD_002303b7_caseD_17;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->outputshape_);
      }
      goto LAB_002302ed;
    default:
      if ((uVar7 != 0x3d) || (cVar11 != -0x16)) goto switchD_002303b7_caseD_17;
      if (this->bias_ == (WeightParams *)0x0) {
        pWVar9 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(pWVar9);
        this->bias_ = pWVar9;
      }
      pWVar9 = this->bias_;
LAB_0023040b:
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar5 = true;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < byte_limit;
      }
      iVar14 = 6;
      if ((((bVar5) &&
           (pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,byte_limit), -1 < (long)pVar10)) &&
          (bVar5 = WeightParams::MergePartialFromCodedStream(pWVar9,input), bVar5)) &&
         (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar10.first), bVar5)) goto LAB_002302f5;
      goto LAB_002302f8;
    }
LAB_002306de:
    if (sVar6 == 0) {
switchD_002303b7_caseD_17:
      iVar14 = 7;
      if ((uVar12 & 7) != 4 && uVar12 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar12);
LAB_002302ed:
        if (bVar5 != false) goto LAB_002302f5;
        iVar14 = 6;
      }
    }
    else {
      iVar14 = 6;
      if (sVar6 != 1) {
LAB_002302f5:
        iVar14 = 0;
      }
    }
LAB_002302f8:
    if (iVar14 != 0) {
      return iVar14 != 6;
    }
  } while( true );
}

Assistant:

bool Convolution3DLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Convolution3DLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 outputChannels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &outputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 inputChannels = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &inputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 nGroups = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &ngroups_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelDepth = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kerneldepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelHeight = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(168u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelWidth = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(176u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelwidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideDepth = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(248u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridedepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideHeight = 32;
      case 32: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(256u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &strideheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideWidth = 33;
      case 33: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(264u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridewidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 dilationDepth = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(320u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &dilationdepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 dilationHeight = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(328u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &dilationheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 dilationWidth = 42;
      case 42: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(336u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &dilationwidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 61;
      case 61: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(490u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(560u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_paddingtype(static_cast< ::CoreML::Specification::Convolution3DLayerParams_PaddingType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingFront = 80;
      case 80: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(640u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingfront_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBack = 81;
      case 81: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(648u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingback_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingTop = 82;
      case 82: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(656u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingtop_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBottom = 83;
      case 83: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(664u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingbottom_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingLeft = 84;
      case 84: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(672u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingleft_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingRight = 85;
      case 85: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(680u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingright_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isDeconvolution = 86;
      case 86: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(688u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isdeconvolution_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 outputShape = 87;
      case 87: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(698u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_outputshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(696u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 698u, input, this->mutable_outputshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Convolution3DLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Convolution3DLayerParams)
  return false;
#undef DO_
}